

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

void __thiscall google::protobuf::DescriptorProto::set_name(DescriptorProto *this,char *value)

{
  LogMessage *other;
  allocator local_71;
  string local_70;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x12b6);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: value != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
  std::__cxx11::string::string((string *)&local_70,value,&local_71);
  internal::ArenaStringPtr::SetNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void DescriptorProto::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_name();
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.DescriptorProto.name)
}